

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O1

void duckdb::CAPIAggregateUpdate
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,Vector *state,
               idx_t count)

{
  FunctionData *pFVar1;
  InvalidInputException *this;
  CAggregateExecuteInfo exec_info;
  DataChunk chunk;
  _func_int **local_a0;
  char local_98;
  string local_90;
  DataChunk local_70;
  
  DataChunk::DataChunk(&local_70);
  if (input_count != 0) {
    do {
      Vector::Flatten(inputs,count);
      ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::emplace_back<duckdb::Vector&>
                ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&local_70,inputs);
      inputs = inputs + 1;
      input_count = input_count - 1;
    } while (input_count != 0);
  }
  local_70.count = count;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  pFVar1 = (aggr_input_data->bind_data).ptr;
  local_a0 = pFVar1[1]._vptr_FunctionData;
  local_98 = '\x01';
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  (*pFVar1[1]._vptr_FunctionData[3])(&local_a0,&local_70,state->data);
  if (local_98 != '\0') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    DataChunk::~DataChunk(&local_70);
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  InvalidInputException::InvalidInputException(this,&local_90);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CAPIAggregateUpdate(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count, Vector &state,
                         idx_t count) {
	DataChunk chunk;
	for (idx_t c = 0; c < input_count; c++) {
		inputs[c].Flatten(count);
		chunk.data.emplace_back(inputs[c]);
	}
	chunk.SetCardinality(count);

	auto &bind_data = aggr_input_data.bind_data->Cast<CAggregateFunctionBindData>();
	auto state_data = FlatVector::GetData<duckdb_aggregate_state>(state);
	auto c_input_chunk = reinterpret_cast<duckdb_data_chunk>(&chunk);

	CAggregateExecuteInfo exec_info(bind_data.info);
	auto c_function_info = reinterpret_cast<duckdb_function_info>(&exec_info);
	bind_data.info.update(c_function_info, c_input_chunk, state_data);
	if (!exec_info.success) {
		throw InvalidInputException(exec_info.error);
	}
}